

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcol.c
# Opt level: O0

int ffgcvn(fitsfile *fptr,int ncols,int *datatype,int *colnum,LONGLONG firstrow,LONGLONG nrows,
          void **nulval,void **array,int *anynul,int *status)

{
  long in_RCX;
  long in_RDX;
  int in_ESI;
  long in_R8;
  long in_R9;
  undefined8 *in_stack_00000008;
  undefined8 *in_stack_00000010;
  int *in_stack_00000020;
  char errmsg [100];
  char *array1;
  LONGLONG nelem1;
  int icol_1;
  LONGLONG width;
  LONGLONG repeat;
  int typecode;
  int icol;
  size_t sizes [255];
  LONGLONG *repeats;
  long nrowbuf;
  LONGLONG currow;
  LONGLONG nread;
  LONGLONG ndone;
  LONGLONG ntotrows;
  int *in_stack_fffffffffffff658;
  LONGLONG *in_stack_fffffffffffff660;
  fitsfile *in_stack_fffffffffffff668;
  long *in_stack_fffffffffffff670;
  fitsfile *in_stack_fffffffffffff678;
  LONGLONG *in_stack_fffffffffffff680;
  int *in_stack_fffffffffffff688;
  undefined4 in_stack_fffffffffffff690;
  int in_stack_fffffffffffff694;
  fitsfile *in_stack_fffffffffffff698;
  LONGLONG in_stack_fffffffffffff6a0;
  undefined8 in_stack_fffffffffffff6a8;
  fitsfile *in_stack_fffffffffffff6b0;
  void *in_stack_fffffffffffff6e0;
  void *in_stack_fffffffffffff6e8;
  undefined7 in_stack_fffffffffffff6f0;
  undefined1 uVar1;
  int *in_stack_fffffffffffff6f8;
  int local_884;
  undefined8 local_878;
  int local_870;
  int local_86c;
  long local_868 [11];
  undefined8 local_810;
  undefined8 local_808;
  undefined8 local_7f8;
  undefined8 local_7c8;
  undefined8 local_7c0;
  undefined8 local_778;
  undefined8 local_770;
  undefined8 local_728;
  undefined8 local_720;
  undefined8 local_718;
  undefined8 local_5e8;
  undefined8 local_5e0;
  undefined8 local_5d8;
  undefined8 local_350;
  void *local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  int local_1c;
  int local_c;
  
  local_70 = (void *)0x0;
  local_40 = in_R9;
  local_38 = in_R8;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_1c = in_ESI;
  memset(local_868,0,0x7f8);
  local_7f8 = 1;
  local_808 = 1;
  local_810 = 1;
  local_7c0 = 2;
  local_7c8 = 2;
  local_778 = 4;
  local_770 = 4;
  local_728 = 8;
  local_720 = 8;
  local_5e8 = 8;
  local_5e0 = 8;
  local_718 = 4;
  local_5d8 = 8;
  local_350 = 0x10;
  if (*in_stack_00000020 < 1) {
    if (local_1c < 1) {
      *in_stack_00000020 = 0;
      local_c = 0;
    }
    else {
      local_70 = malloc((long)local_1c << 3);
      if (local_70 == (void *)0x0) {
        *in_stack_00000020 = 0x71;
        local_c = 0x71;
      }
      else {
        ffgnrwll(in_stack_fffffffffffff668,in_stack_fffffffffffff660,in_stack_fffffffffffff658);
        ffgrsz(in_stack_fffffffffffff678,in_stack_fffffffffffff670,
               &in_stack_fffffffffffff668->HDUposition);
        for (local_86c = 0; uVar1 = local_86c < local_1c && local_86c < 1000,
            local_86c < local_1c && local_86c < 1000; local_86c = local_86c + 1) {
          ffgtclll(in_stack_fffffffffffff698,in_stack_fffffffffffff694,in_stack_fffffffffffff688,
                   in_stack_fffffffffffff680,(LONGLONG *)in_stack_fffffffffffff678,
                   (int *)in_stack_fffffffffffff670);
          *(undefined8 *)((long)local_70 + (long)local_86c * 8) = local_878;
          if (((*(int *)(local_28 + (long)local_86c * 4) == 1) ||
              (*(int *)(local_28 + (long)local_86c * 4) == 0x10)) ||
             (local_868[*(int *)(local_28 + (long)local_86c * 4)] == 0)) {
            ffpmsg((char *)0x17b5a2);
            *in_stack_00000020 = 0x19a;
          }
          if (local_870 < 0) {
            ffpmsg((char *)0x17b5c6);
            *in_stack_00000020 = 0x140;
          }
          if (*in_stack_00000020 != 0) break;
        }
        if (*in_stack_00000020 == 0) {
          if (local_1c == 1) {
            ffgcv(in_stack_fffffffffffff6b0,(int)((ulong)in_stack_fffffffffffff6a8 >> 0x20),
                  (int)in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0,
                  (LONGLONG)in_stack_fffffffffffff698,
                  CONCAT44(in_stack_fffffffffffff694,in_stack_fffffffffffff690),
                  (void *)*in_stack_00000008,(void *)*in_stack_00000010,
                  (int *)CONCAT17(uVar1,in_stack_fffffffffffff6f0),in_stack_fffffffffffff6f8);
            free(local_70);
            local_c = *in_stack_00000020;
          }
          else {
            local_60 = local_38;
            for (local_50 = 0; local_50 < local_40; local_50 = local_58 + local_50) {
              local_58 = local_40 - local_50;
              if (local_68 < local_40 - local_50) {
                local_58 = local_68;
              }
              for (local_884 = 0; local_884 < local_1c; local_884 = local_884 + 1) {
                ffgcv((fitsfile *)
                      (in_stack_00000010[local_884] +
                      *(long *)((long)local_70 + (long)local_884 * 8) * local_50 *
                      local_868[*(int *)(local_28 + (long)local_884 * 4)]),
                      (int)((ulong)in_stack_00000008[local_884] >> 0x20),
                      (int)in_stack_00000008[local_884],
                      local_58 * *(long *)((long)local_70 + (long)local_884 * 8),local_60,
                      CONCAT44(*(undefined4 *)(local_30 + (long)local_884 * 4),
                               *(undefined4 *)(local_28 + (long)local_884 * 4)),
                      in_stack_fffffffffffff6e0,in_stack_fffffffffffff6e8,
                      (int *)CONCAT17(uVar1,in_stack_fffffffffffff6f0),in_stack_fffffffffffff6f8);
                if (*in_stack_00000020 != 0) {
                  sprintf(&stack0xfffffffffffff6f8,
                          "Failed to read column %d data rows %lld-%lld (ffgcvn)",
                          (ulong)*(uint *)(local_30 + (long)local_884 * 4),local_60,
                          local_60 + local_58 + -1);
                  ffpmsg((char *)0x17b9ad);
                  break;
                }
              }
              if (*in_stack_00000020 != 0) break;
              local_60 = local_58 + local_60;
            }
            free(local_70);
            local_c = *in_stack_00000020;
          }
        }
        else {
          free(local_70);
          local_c = *in_stack_00000020;
        }
      }
    }
  }
  else {
    local_c = *in_stack_00000020;
  }
  return local_c;
}

Assistant:

int ffgcvn( fitsfile *fptr,   /* I - FITS file pointer                       */
	    int ncols,        /* I - number of columns to read               */
            int  *datatype,   /* I - datatypes of the values                 */
            int  *colnum,     /* I - columns numbers to read (1 = 1st col)   */
            LONGLONG  firstrow,   /* I - first row to read (1 = 1st row)     */
            LONGLONG nrows,       /* I - number of rows to read              */
            void **nulval,    /* I - array of pointers to values for undefined pixels */
            void **array,     /* O - array of pointers to values that are returned    */
            int  *anynul,     /* O - anynul[i] set to 1 if any values in column i are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read arrays of values from NCOLS table columns. This is an optimization
  to read all columns in one pass through the table.  The datatypes of the
  input arrays are defined by the 3rd argument.  Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  Undefined elements for column i will be set equal to *(nulval[i]), unless nulval[i]=0
  in which case no checking for undefined values will be performed.
  anynul[i] is returned with a value of true if any pixels in column i are undefined.
*/
{
    LONGLONG ntotrows, ndone, nread, currow;
    long nrowbuf;
    LONGLONG *repeats = 0;
    size_t sizes[255] = {0};
    int icol;

    sizes[TBYTE] = sizes[TSBYTE] = sizes[TLOGICAL] = sizeof(char);
    sizes[TUSHORT] = sizes[TSHORT] = sizeof(short int);
    sizes[TINT] = sizes[TUINT] = sizeof(int);
    sizes[TLONG] = sizes[TULONG] = sizeof(long int);
    sizes[TLONGLONG] = sizes[TULONGLONG] = sizeof(LONGLONG);
    sizes[TFLOAT] = sizeof(float);
    sizes[TDOUBLE] = sizeof(double);
    sizes[TDBLCOMPLEX] = 2*sizeof(double);

    if (*status > 0)
        return(*status);

    if (ncols <= 0) return (*status=0);

    repeats = malloc(sizeof(LONGLONG)*ncols);
    if (repeats == 0) return (*status=MEMORY_ALLOCATION);

    fits_get_num_rowsll(fptr, &ntotrows, status);
    fits_get_rowsize(fptr, &nrowbuf, status);

    /* Retrieve column repeats */
    for (icol = 0; (icol < ncols) && (icol < 1000); icol++) {
      int typecode;
      LONGLONG repeat, width;
      fits_get_coltypell(fptr, colnum[icol], &typecode, 
			 &repeat, &width, status);
      repeats[icol] = repeat;

      if (datatype[icol] == TBIT || datatype[icol] == TSTRING ||
	  sizes[datatype[icol]] == 0) {
	ffpmsg("Cannot read from TBIT or TSTRING datatypes (ffgcvn)");
	*status = BAD_DATATYPE;
      }
      if (typecode < 0) {
	ffpmsg("Cannot read from variable-length data (ffgcvn)");
	*status = BAD_DIMEN;
      }

      if (*status) break;
    }
    if (*status) {
      free(repeats);
      return *status;
    }

    /* Optimize for 1 column */
    if (ncols == 1) {
      fits_read_col(fptr, datatype[0], colnum[0], firstrow, 1,
		    nrows*repeats[0], nulval[0], 
		    array[0], anynul ? &(anynul[0]) : 0, status);
      free(repeats);
      return *status;
    }

    /* Scan through file, in chunks of nrowbuf */
    currow = firstrow;
    ndone = 0;
    while (ndone < nrows) {
      int icol;
      nread = (nrows-ndone);  /* Number of rows to read (not elements) */
      if (nread > nrowbuf) nread = nrowbuf;

      for (icol=0; icol<ncols; icol++) {
	LONGLONG nelem1 = (nread*repeats[icol]);
	char *array1 = (char *) array[icol] + repeats[icol]*ndone*sizes[datatype[icol]];

	fits_read_col(fptr, datatype[icol], colnum[icol], currow, 1, 
		      nelem1, nulval[icol], array1, 
		      (anynul ? &(anynul[icol]) : 0), status);
	if (*status) {
	  char errmsg[100];
	  sprintf(errmsg, 
		  "Failed to read column %d data rows %lld-%lld (ffgcvn)",
		  colnum[icol], currow, currow+nread-1);
	  ffpmsg(errmsg);
	  break;
	}
      }

      if (*status) break;
      currow += nread;
      ndone += nread;
    }

    free(repeats);
    return *status;
}